

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t create_decode_tables(uint8_t *bit_length,decode_table *table,wchar_t size)

{
  uint16_t *__s;
  int *piVar1;
  uint32_t uVar2;
  bool bVar3;
  wchar_t wVar4;
  uint16_t uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  wchar_t wVar13;
  int iVar14;
  wchar_t lc [16];
  uint32_t decode_pos_clone [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  __s = table->decode_num;
  iVar14 = 0;
  memset(__s,0,0x264);
  table->size = size;
  table->quick_bits = (uint)(size == L'Ĳ') * 3 + 7;
  if (L'\0' < size) {
    uVar6 = 0;
    do {
      piVar1 = (int *)((long)&local_a8 + (ulong)(bit_length[uVar6] & 0xf) * 4);
      *piVar1 = *piVar1 + 1;
      uVar6 = uVar6 + 1;
    } while ((uint)size != uVar6);
  }
  local_a8 = local_a8 & 0xffffffff00000000;
  table->decode_pos[0] = 0;
  table->decode_len[0] = 0;
  lVar7 = 0xf;
  lVar9 = 0;
  iVar11 = 0;
  do {
    iVar11 = iVar11 + *(int *)((long)&local_a8 + lVar9 + 4);
    *(int *)((long)table->decode_len + lVar9 + 4) = iVar11 << ((byte)lVar7 & 0x1f);
    iVar14 = iVar14 + *(int *)((long)&local_a8 + lVar9);
    *(int *)((long)table->decode_pos + lVar9 + 4) = iVar14;
    iVar11 = iVar11 * 2;
    lVar9 = lVar9 + 4;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  local_38 = *(undefined8 *)(table->decode_pos + 0xc);
  uStack_30 = *(undefined8 *)(table->decode_pos + 0xe);
  local_48 = *(undefined8 *)(table->decode_pos + 8);
  uStack_40 = *(undefined8 *)(table->decode_pos + 10);
  local_58 = *(undefined8 *)(table->decode_pos + 4);
  uStack_50 = *(undefined8 *)(table->decode_pos + 6);
  local_68 = *(undefined8 *)table->decode_pos;
  uStack_60 = *(undefined8 *)(table->decode_pos + 2);
  if (L'\0' < size) {
    uVar6 = 0;
    do {
      uVar8 = (ulong)bit_length[uVar6] & 0xf;
      if ((bit_length[uVar6] & 0xf) != 0) {
        iVar14 = *(int *)((long)&local_68 + uVar8 * 4);
        __s[iVar14] = (uint16_t)uVar6;
        *(int *)((long)&local_68 + uVar8 * 4) = iVar14 + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)size != uVar6);
  }
  uVar2 = table->quick_bits;
  wVar4 = size;
  if (uVar2 != 0x3f) {
    lVar9 = 1L << ((byte)uVar2 & 0x3f);
    lVar7 = 1;
    wVar4 = L'\x10' - uVar2;
    if (lVar9 < 2) {
      lVar9 = 1;
    }
    lVar12 = 0;
    do {
      iVar14 = (int)lVar12 << ((byte)wVar4 & 0x1f);
      bVar3 = lVar7 < 0x10;
      if ((lVar7 < 0x10) && (table->decode_len[lVar7] <= iVar14)) {
        do {
          lVar10 = lVar7;
          if (lVar10 == 0xf) {
            lVar7 = 0x10;
            break;
          }
          lVar7 = lVar10 + 1;
        } while (table->decode_len[lVar10 + 1] <= iVar14);
        bVar3 = lVar10 < 0xf;
      }
      table->quick_len[lVar12] = (uint8_t)lVar7;
      uVar5 = 0;
      if ((bVar3) &&
         (wVar13 = (iVar14 - table->decode_len[lVar7 + -1] >> (0x10 - (uint8_t)lVar7 & 0x1f)) +
                   table->decode_pos[(uint)lVar7 & 0xf], uVar5 = 0, wVar13 < size)) {
        uVar5 = __s[wVar13];
      }
      table->quick_num[lVar12] = uVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar9);
  }
  return wVar4;
}

Assistant:

static int create_decode_tables(uint8_t* bit_length,
    struct decode_table* table, int size)
{
	int code, upper_limit = 0, i, lc[16];
	uint32_t decode_pos_clone[rar5_countof(table->decode_pos)];
	ssize_t cur_len, quick_data_size;

	memset(&lc, 0, sizeof(lc));
	memset(table->decode_num, 0, sizeof(table->decode_num));
	table->size = size;
	table->quick_bits = size == HUFF_NC ? 10 : 7;

	for(i = 0; i < size; i++) {
		lc[bit_length[i] & 15]++;
	}

	lc[0] = 0;
	table->decode_pos[0] = 0;
	table->decode_len[0] = 0;

	for(i = 1; i < 16; i++) {
		upper_limit += lc[i];

		table->decode_len[i] = upper_limit << (16 - i);
		table->decode_pos[i] = table->decode_pos[i - 1] + lc[i - 1];

		upper_limit <<= 1;
	}

	memcpy(decode_pos_clone, table->decode_pos, sizeof(decode_pos_clone));

	for(i = 0; i < size; i++) {
		uint8_t clen = bit_length[i] & 15;
		if(clen > 0) {
			int last_pos = decode_pos_clone[clen];
			table->decode_num[last_pos] = i;
			decode_pos_clone[clen]++;
		}
	}

	quick_data_size = (int64_t)1 << table->quick_bits;
	cur_len = 1;
	for(code = 0; code < quick_data_size; code++) {
		int bit_field = code << (16 - table->quick_bits);
		int dist, pos;

		while(cur_len < rar5_countof(table->decode_len) &&
				bit_field >= table->decode_len[cur_len]) {
			cur_len++;
		}

		table->quick_len[code] = (uint8_t) cur_len;

		dist = bit_field - table->decode_len[cur_len - 1];
		dist >>= (16 - cur_len);

		pos = table->decode_pos[cur_len & 15] + dist;
		if(cur_len < rar5_countof(table->decode_pos) && pos < size) {
			table->quick_num[code] = table->decode_num[pos];
		} else {
			table->quick_num[code] = 0;
		}
	}

	return ARCHIVE_OK;
}